

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTransaction::RemoveTxOut(ConfidentialTransaction *this,uint32_t index)

{
  __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
  local_20;
  const_iterator ite;
  uint32_t index_local;
  ConfidentialTransaction *this_local;
  
  ite._M_current._4_4_ = index;
  AbstractTransaction::RemoveTxOut(&this->super_AbstractTransaction,index);
  local_20._M_current =
       (ConfidentialTxOut *)
       ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
       cbegin(&this->vout_);
  if (ite._M_current._4_4_ != 0) {
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
    ::operator+=(&local_20,(ulong)ite._M_current._4_4_);
  }
  ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::erase
            (&this->vout_,(const_iterator)local_20._M_current);
  return;
}

Assistant:

void ConfidentialTransaction::RemoveTxOut(uint32_t index) {
  AbstractTransaction::RemoveTxOut(index);

  std::vector<ConfidentialTxOut>::const_iterator ite = vout_.cbegin();
  if (index != 0) {
    ite += index;
  }
  vout_.erase(ite);
}